

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QObject>_>::erase
          (QMovableArrayOps<QPointer<QObject>_> *this,QPointer<QObject> *b,qsizetype n)

{
  Data **__src;
  QArrayDataPointer<QPointer<QObject>_> *pQVar1;
  QPointer<QObject> *pQVar2;
  long in_RDX;
  QArrayDataPointer<QPointer<QObject>_> *in_RSI;
  long in_RDI;
  QPointer<QObject> *e;
  QPointer<QObject> *in_stack_ffffffffffffffa8;
  QArrayDataPointer<QPointer<QObject>_> *in_stack_ffffffffffffffb0;
  
  __src = &in_RSI->d + in_RDX * 2;
  std::destroy<QPointer<QObject>*>
            ((QPointer<QObject> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pQVar1 = (QArrayDataPointer<QPointer<QObject>_> *)
           QArrayDataPointer<QPointer<QObject>_>::begin
                     ((QArrayDataPointer<QPointer<QObject>_> *)0x40ed5a);
  if ((in_RSI == pQVar1) &&
     (pQVar2 = QArrayDataPointer<QPointer<QObject>_>::end(in_stack_ffffffffffffffb0),
     (QPointer<QObject> *)__src != pQVar2)) {
    *(Data ***)(in_RDI + 8) = __src;
  }
  else {
    pQVar2 = QArrayDataPointer<QPointer<QObject>_>::end(in_stack_ffffffffffffffb0);
    if ((QPointer<QObject> *)__src != pQVar2) {
      pQVar2 = QArrayDataPointer<QPointer<QObject>_>::end(in_RSI);
      memmove(in_RSI,__src,((long)pQVar2 - (long)__src >> 4) << 4);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }